

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

void Fraig_ManMarkRealFanouts(Fraig_Man_t *p)

{
  undefined1 *puVar1;
  Fraig_NodeVec_t *p_00;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  p_00 = Fraig_Dfs(p,0);
  for (lVar3 = 0; uVar2 = (ulong)p_00->nSize, lVar3 < (long)uVar2; lVar3 = lVar3 + 1) {
    puVar1 = &p_00->pArray[lVar3]->field_0x18;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffff3ff;
    p_00->pArray[lVar3]->pData0 = (Fraig_Node_t *)0x0;
  }
  for (lVar3 = 0; lVar3 < (int)uVar2; lVar3 = lVar3 + 1) {
    uVar2 = (ulong)p_00->pArray[lVar3]->p1 & 0xfffffffffffffffe;
    if (uVar2 != 0) {
      uVar5 = (*(uint *)(uVar2 + 0x18) >> 10) + 1 & 3;
      uVar4 = *(uint *)(uVar2 + 0x18) & 0xfffff3ff;
      *(uint *)(uVar2 + 0x18) = uVar5 << 10 | uVar4;
      if (uVar5 == 3) {
        *(uint *)(uVar2 + 0x18) = uVar4 | 0x800;
      }
    }
    uVar2 = (ulong)p_00->pArray[lVar3]->p2 & 0xfffffffffffffffe;
    if (uVar2 != 0) {
      uVar5 = (*(uint *)(uVar2 + 0x18) >> 10) + 1 & 3;
      uVar4 = *(uint *)(uVar2 + 0x18) & 0xfffff3ff;
      *(uint *)(uVar2 + 0x18) = uVar5 << 10 | uVar4;
      if (uVar5 == 3) {
        *(uint *)(uVar2 + 0x18) = uVar4 | 0x800;
      }
    }
    uVar2 = (ulong)(uint)p_00->nSize;
  }
  Fraig_NodeVecFree(p_00);
  return;
}

Assistant:

void Fraig_ManMarkRealFanouts( Fraig_Man_t * p )
{
    Fraig_NodeVec_t * vNodes;
    Fraig_Node_t * pNodeR;
    int i;
    // collect the nodes reachable
    vNodes = Fraig_Dfs( p, 0 );
    // clean the fanouts field
    for ( i = 0; i < vNodes->nSize; i++ )
    {
        vNodes->pArray[i]->nFanouts = 0;
        vNodes->pArray[i]->pData0 = NULL;
    }
    // mark reachable nodes by setting the two-bit counter pNode->nFans
    for ( i = 0; i < vNodes->nSize; i++ )
    {
        pNodeR = Fraig_Regular(vNodes->pArray[i]->p1);
        if ( pNodeR && ++pNodeR->nFanouts == 3 )
            pNodeR->nFanouts = 2;
        pNodeR = Fraig_Regular(vNodes->pArray[i]->p2);
        if ( pNodeR && ++pNodeR->nFanouts == 3 )
            pNodeR->nFanouts = 2;
    }
    Fraig_NodeVecFree( vNodes );
}